

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDDD.h
# Opt level: O1

void __thiscall
chrono::fea::ChNodeFEAxyzDDD::LoadableGetStateBlock_w
          (ChNodeFEAxyzDDD *this,int block_offset,ChStateDelta *mDDD)

{
  double *pdVar1;
  Index index;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((-1 < block_offset) &&
     ((long)block_offset <=
      (mDDD->super_ChVectorDynamic<double>).
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3)) {
    pdVar1 = (mDDD->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             block_offset;
    uVar2 = 3;
    if ((((ulong)pdVar1 & 7) == 0) &&
       (uVar3 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), uVar3 < 3)) {
      uVar2 = uVar3;
    }
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        pdVar1[uVar3] =
             (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.X0.m_data
             [uVar3 - 0x10];
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    if (uVar2 < 3) {
      do {
        pdVar1[uVar2] =
             (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.X0.m_data
             [uVar2 - 0x10];
        uVar2 = uVar2 + 1;
      } while (uVar2 != 3);
    }
    uVar2 = (ulong)(uint)block_offset;
    if ((long)(uVar2 + 3) <=
        (mDDD->super_ChVectorDynamic<double>).
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3) {
      pdVar1 = (mDDD->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               uVar2 + 3;
      uVar3 = 3;
      if ((((ulong)pdVar1 & 7) == 0) &&
         (uVar4 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
        uVar3 = uVar4;
      }
      if (uVar3 != 0) {
        uVar4 = 0;
        do {
          pdVar1[uVar4] = (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.D_dt.m_data[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
      if (uVar3 < 3) {
        do {
          pdVar1[uVar3] = (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.D_dt.m_data[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar3 != 3);
      }
      if ((long)(uVar2 + 6) <=
          (mDDD->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3) {
        pdVar1 = (mDDD->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 uVar2 + 6;
        uVar3 = 3;
        if ((((ulong)pdVar1 & 7) == 0) &&
           (uVar4 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
          uVar3 = uVar4;
        }
        if (uVar3 != 0) {
          uVar4 = 0;
          do {
            pdVar1[uVar4] = (this->super_ChNodeFEAxyzDD).DD_dt.m_data[uVar4];
            uVar4 = uVar4 + 1;
          } while (uVar3 != uVar4);
        }
        if (uVar3 < 3) {
          do {
            pdVar1[uVar3] = (this->super_ChNodeFEAxyzDD).DD_dt.m_data[uVar3];
            uVar3 = uVar3 + 1;
          } while (uVar3 != 3);
        }
        if ((long)(uVar2 + 9) <=
            (mDDD->super_ChVectorDynamic<double>).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3) {
          pdVar1 = (mDDD->super_ChVectorDynamic<double>).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                   uVar2 + 9;
          uVar2 = 3;
          if ((((ulong)pdVar1 & 7) == 0) &&
             (uVar3 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), uVar3 < 3)) {
            uVar2 = uVar3;
          }
          if (uVar2 != 0) {
            uVar3 = 0;
            do {
              pdVar1[uVar3] = (this->DDD_dt).m_data[uVar3];
              uVar3 = uVar3 + 1;
            } while (uVar2 != uVar3);
          }
          if (uVar2 < 3) {
            do {
              pdVar1[uVar2] = (this->DDD_dt).m_data[uVar2];
              uVar2 = uVar2 + 1;
            } while (uVar2 != 3);
          }
          return;
        }
      }
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

virtual void LoadableGetStateBlock_w(int block_offset, ChStateDelta& mDDD) override {
        mDDD.segment(block_offset + 0, 3) = pos_dt.eigen();
        mDDD.segment(block_offset + 3, 3) = D_dt.eigen();
        mDDD.segment(block_offset + 6, 3) = DD_dt.eigen();
        mDDD.segment(block_offset + 9, 3) = DDD_dt.eigen();
    }